

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildExpression(CNscPStackEntry *pExpression,CNscPStackEntry *pAssignment)

{
  byte *pbVar1;
  
  if (pExpression == (CNscPStackEntry *)0x0) {
    pExpression = CNscContext::GetPStackEntryInt(g_pCtx);
    CNscPStackEntry::SetType(pExpression,NscType_Unknown);
  }
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pAssignment == (CNscPStackEntry *)0x0) {
      return pExpression;
    }
  }
  else {
    CNscPStackEntry::SetType(pExpression,pAssignment->m_nType);
    CNscPStackEntry::AppendData(pExpression,pAssignment);
    pbVar1 = (byte *)((long)&pExpression->m_ulFlags + 2);
    *pbVar1 = *pbVar1 | 0x80;
  }
  CNwnDoubleLinkList::InsertAfter(&pAssignment->m_link,&g_pCtx->m_listEntryFree);
  return pExpression;
}

Assistant:

YYSTYPE NscBuildExpression (YYSTYPE pExpression, YYSTYPE pAssignment)
{

	//
	// NOTE: Currently, we do not support commas in expressions 
	// (i.e. int i = 5, 6)
	//

	CNscPStackEntry *pOut = pExpression;
	
	//
	// If there isn't an expression, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pAssignment)
			g_pCtx ->FreePStackEntry (pAssignment);
		return pOut;
	}
	
	//
	// Process the assignment
	//

	pOut ->SetType (pAssignment ->GetType ());
	pOut ->AppendData (pAssignment);
	pOut ->SetFlags (pOut ->GetFlags () | NscSymFlag_InExpression);
	g_pCtx ->FreePStackEntry (pAssignment);

	//
	// Return the new expression
	//

	return pOut;
}